

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::MessageOptions::ByteSizeLong(MessageOptions *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  Rep *pRVar4;
  long lVar5;
  long lVar6;
  
  sVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  lVar6 = (long)(this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = sVar2 + lVar6 * 2;
  pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    pRVar4 = (Rep *)pRVar4->elements;
  }
  for (lVar5 = 0; lVar6 * 8 != lVar5; lVar5 = lVar5 + 8) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>
                      (*(UninterpretedOption **)((long)pRVar4->elements + lVar5 + -8));
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    sVar2 = sVar2 + (uVar1 & 2) + (ulong)(uVar1 & 1) * 2 +
            (ulong)(uVar1 >> 2 & 2) + (ulong)(uVar1 >> 1 & 2);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type_conflict)sVar2;
    return sVar2;
  }
  sVar2 = internal::ComputeUnknownFieldsSize(&this->_internal_metadata_,sVar2,&this->_cached_size_);
  return sVar2;
}

Assistant:

size_t MessageOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.MessageOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2UL * this->_internal_uninterpreted_option_size();
  for (const auto& msg : this->uninterpreted_option_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    // optional bool message_set_wire_format = 1 [default = false];
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 + 1;
    }

    // optional bool no_standard_descriptor_accessor = 2 [default = false];
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 + 1;
    }

    // optional bool map_entry = 7;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 + 1;
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}